

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

DdNode * Extra_bddEncodingBinary
                   (DdManager *dd,DdNode **pbFuncs,int nFuncs,DdNode **pbVars,int nVars)

{
  int iVar1;
  DdNode *pDVar2;
  DdNode *n;
  uint uVar3;
  DdNode *n_00;
  ulong uVar4;
  ulong uVar5;
  
  iVar1 = nFuncs;
  if (1 < (uint)nFuncs) {
    iVar1 = 0;
    for (uVar3 = nFuncs - 1; uVar3 != 0; uVar3 = uVar3 >> 1) {
      iVar1 = iVar1 + 1;
    }
  }
  if (iVar1 <= nVars) {
    n_00 = (DdNode *)((ulong)dd->one ^ 1);
    Cudd_Ref(n_00);
    uVar4 = 0;
    uVar5 = (ulong)(uint)nFuncs;
    if (nFuncs < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      pDVar2 = Extra_bddBitsToCube(dd,(int)uVar4,nVars,pbVars,1);
      Cudd_Ref(pDVar2);
      n = Cudd_bddAnd(dd,pDVar2,pbFuncs[uVar4]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,pDVar2);
      pDVar2 = Cudd_bddOr(dd,n,n_00);
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,n_00);
      Cudd_RecursiveDeref(dd,n);
      n_00 = pDVar2;
    }
    Cudd_Deref(n_00);
    return n_00;
  }
  __assert_fail("nVars >= Abc_Base2Log(nFuncs)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddCas.c"
                ,0x95,"DdNode *Extra_bddEncodingBinary(DdManager *, DdNode **, int, DdNode **, int)"
               );
}

Assistant:

DdNode * 
Extra_bddEncodingBinary( 
  DdManager * dd, 
  DdNode ** pbFuncs,    // pbFuncs is the array of columns to be encoded
  int nFuncs,           // nFuncs is the number of columns in the array
  DdNode ** pbVars,     // pbVars is the array of variables to use for the codes
  int nVars )           // nVars is the column multiplicity, [log2(nFuncs)]
{
    int i;
    DdNode * bResult;
    DdNode * bCube, * bTemp, * bProd;

    assert( nVars >= Abc_Base2Log(nFuncs) );

    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nFuncs; i++ )
    {
        bCube   = Extra_bddBitsToCube( dd, i, nVars, pbVars, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbFuncs[i] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );     Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    Cudd_Deref( bResult );
    return bResult;
}